

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall Clasp::DefaultMinimize::propagateImpl(DefaultMinimize *this,Solver *s,PropMode m)

{
  SharedData *pSVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Iter lit;
  uint32 level;
  int iVar8;
  uint32 undoPos;
  uint local_64;
  uint32 local_54;
  wsum_t *local_50;
  wsum_t *local_48;
  uint32 *local_40;
  Antecedent local_38;
  
  pSVar1 = (this->super_MinimizeConstraint).shared_;
  lit = this->pos_;
  uVar7 = (ulong)((long)lit + (-0x68 - (long)pSVar1)) >> 3;
  local_64 = (s->levels_).super_type.ebo_.size;
  local_54 = this->undoTop_;
  uVar6 = 0;
  if ((pSVar1->adjust_).ebo_.size != 1) {
    uVar6 = *(uint *)((pSVar1->weights).ebo_.buf +
                     *(uint *)((long)pSVar1[1].up_ + (uVar7 & 0xffffffff) * 8 + -0xc)) & 0x7fffffff;
  }
  level = (m == propagate_new_opt) + local_64;
  local_40 = &this->actLev_;
  uVar5 = this->actLev_;
  if (uVar6 < this->actLev_) {
    uVar5 = uVar6;
  }
  this->actLev_ = uVar5;
  local_48 = this->bounds_;
  local_50 = local_48 + this->size_;
  bVar3 = true;
  iVar8 = -1;
  do {
    uVar6 = (lit->first).rep_;
    if (uVar6 < 4) break;
    if ((-1 < (int)this->undo_[uVar7 & 0xffffffff].rep) &&
       ((m != propagate_new_sum ||
        ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc)) & 3) !=
         (byte)(((uVar6 & 2) == 0) + 1U))))) {
      if (iVar8 != lit->second) {
        bVar2 = SharedMinimizeData::imp
                          ((this->super_MinimizeConstraint).shared_,local_50,lit,local_48,local_40);
        if (!bVar2) {
          this->pos_ = lit;
          bVar4 = 1;
          goto LAB_0015164b;
        }
        if (m == propagate_new_opt) {
          level = computeImplicationSet(this,s,lit,&local_54);
        }
        iVar8 = lit->second;
      }
      uVar6 = (lit->first).rep_;
      uVar5 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc));
      if (((byte)((byte)uVar5 & 3) != (byte)(((uVar6 & 2) == 0) + 1U)) ||
         ((level < local_64 && (level < uVar5 >> 4)))) {
        if (level != local_64) {
          local_64 = Solver::undoUntil(s,level,1);
        }
        local_38.data_ = (uint64)this;
        bVar3 = Solver::force(s,(Literal)((lit->first).rep_ & 0xfffffffe ^ 2),level,&local_38,
                              local_54);
      }
    }
    lit = lit + 1;
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (bVar3 != false);
  bVar4 = 0;
LAB_0015164b:
  return (bool)(bVar3 | bVar4);
}

Assistant:

bool DefaultMinimize::propagateImpl(Solver& s, PropMode m) {
	Iter it    = pos_;
	uint32 idx = static_cast<uint32>(it - shared_->lits);
	uint32 DL  = s.decisionLevel();
	// current implication level or "unknown" if
	// we propagate a new optimum
	uint32 impLevel = DL + (m == propagate_new_opt);
	weight_t lastW  = -1;
	uint32 undoPos  = undoTop_;
	bool ok         = true;
	actLev_         = std::min(actLev_, shared_->level(idx));
	for (wsum_t* sum= this->sum(), *opt = this->opt(); ok && !isSentinel(it->first); ++it, ++idx) {
		// skip propagated/false literals
		if (litSeen(idx) || (m == propagate_new_sum && s.isFalse(it->first))) {
			continue;
		}
		if (lastW != it->second) {
			// check if the current weight is implied
			if (!STRATEGY(imp(sum, *it, opt, actLev_))) {
				// all good - current optimum is safe
				pos_    = it;
				return true;
			}
			// compute implication set and level of current weight
			if (m == propagate_new_opt) {
				impLevel = computeImplicationSet(s, *it, undoPos);
			}
			lastW = it->second;
		}
		assert(active());
		// force implied literals
		if (!s.isFalse(it->first) || (impLevel < DL && s.level(it->first.var()) > impLevel)) {
			if (impLevel != DL) { DL = s.undoUntil(impLevel, Solver::undo_pop_bt_level); }
			ok = s.force(~it->first, impLevel, this, undoPos);
		}
	}
	return ok;
}